

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialHexaANCF.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChMaterialHexaANCF::Calc_D
          (ChMaterialHexaANCF *this,ChVector<double> *E,ChVector<double> *nu,ChVector<double> *G)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ChMatrixNM<double,_6,_6> D;
  double local_210;
  double local_1f0;
  double dStack_1e8;
  DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_> local_180 [16];
  double local_170;
  undefined1 local_150 [16];
  double local_140;
  undefined1 local_120 [16];
  double local_110;
  double local_d8;
  double local_a0;
  double local_68;
  
  dVar1 = nu->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1;
  auVar4 = *(undefined1 (*) [16])(nu->m_data + 1);
  auVar7._0_8_ = auVar4._0_8_ * E->m_data[2];
  auVar7._8_8_ = auVar4._8_8_ * E->m_data[2];
  auVar15._0_8_ = (dVar1 * E->m_data[1]) / SUB168(*(undefined1 (*) [16])E->m_data,0);
  auVar15._8_8_ = 0;
  auVar7 = vdivpd_avx(auVar7,*(undefined1 (*) [16])E->m_data);
  auVar12 = vshufpd_avx(auVar4,auVar4,1);
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar4,auVar5);
  auVar5 = vunpckhpd_avx(auVar4,auVar6);
  auVar9._8_8_ = 0x3ff0000000000000;
  auVar9._0_8_ = auVar15._0_8_;
  auVar5 = vfmadd231pd_fma(auVar9,auVar7,auVar5);
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  auVar9 = vfnmadd213sd_fma(auVar15,auVar13,auVar5);
  auVar9 = vfnmadd231sd_fma(auVar9,auVar4,auVar7);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * nu->m_data[2];
  auVar11 = vfnmadd213sd_fma(auVar14,auVar7,auVar9);
  auVar9 = vshufpd_avx(auVar7,auVar7,1);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = auVar9._0_8_ * auVar15._0_8_;
  auVar11 = vfnmadd213sd_fma(auVar8,auVar4,auVar11);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>::setZero(local_180);
  dVar1 = E->m_data[0];
  local_210 = auVar11._0_8_;
  dVar2 = E->m_data[1];
  dVar3 = E->m_data[2];
  auVar16._8_8_ = 0x3ff0000000000000;
  auVar16._0_8_ = 0x3ff0000000000000;
  local_1f0 = auVar5._0_8_;
  dStack_1e8 = auVar5._8_8_;
  auVar11._0_8_ = dVar1 * local_1f0;
  auVar11._8_8_ = dVar1 * dStack_1e8;
  auVar10._8_8_ = local_210;
  auVar10._0_8_ = local_210;
  auVar5 = vunpcklpd_avx(auVar16,auVar13);
  local_180 = (DenseBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>  [16])vdivpd_avx(auVar11,auVar10);
  auVar11 = vunpcklpd_avx(auVar6,auVar4);
  auVar5 = vfmadd231pd_fma(auVar5,auVar7,auVar11);
  auVar5 = vshufpd_avx(auVar5,auVar5,1);
  auVar6._0_8_ = auVar5._0_8_ * dVar2;
  auVar6._8_8_ = auVar5._8_8_ * dVar2;
  local_150 = vdivpd_avx(auVar6,auVar10);
  auVar5 = vunpcklpd_avx(auVar13,auVar15);
  auVar4 = vfmadd132pd_fma(auVar5,auVar4,auVar12);
  auVar12._0_8_ = auVar4._0_8_ * dVar3;
  auVar12._8_8_ = auVar4._8_8_ * dVar3;
  local_120 = vdivpd_avx(auVar12,auVar10);
  auVar4 = vfmadd213sd_fma(auVar7,auVar13,auVar9);
  auVar7 = vfmadd213sd_fma(auVar9,auVar15,auVar7);
  auVar12 = vfnmadd213sd_fma(auVar15,auVar13,ZEXT816(0x3ff0000000000000));
  local_170 = (dVar1 * auVar7._0_8_) / local_210;
  local_140 = (auVar4._0_8_ * dVar2) / local_210;
  local_110 = (auVar12._0_8_ * dVar3) / local_210;
  local_d8 = G->m_data[2];
  local_a0 = G->m_data[1];
  local_68 = G->m_data[0];
  Eigen::internal::call_assignment<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,6,1,6,6>>
            (&this->m_D,(Matrix<double,_6,_6,_1,_6,_6> *)local_180);
  return;
}

Assistant:

void ChMaterialHexaANCF::Calc_D(const ChVector<>& E, const ChVector<>& nu, const ChVector<>& G) {
    // orthotropic material ref: http://homes.civil.aau.dk/lda/Continuum/material.pdf
    // except position of the shear terms is different to match the original ANCF reference paper

    double nu_12 = nu.x();
    double nu_13 = nu.y();
    double nu_23 = nu.z();
    double nu_21 = nu_12 * E.y() / E.x();
    double nu_31 = nu_13 * E.z() / E.x();
    double nu_32 = nu_23 * E.z() / E.y();
    double k = 1.0 - nu_23 * nu_32 - nu_12 * nu_21 - nu_13 * nu_31 - nu_12 * nu_23 * nu_31 - nu_21 * nu_32 * nu_13;

    ChMatrixNM<double, 6, 6> D;
    D.setZero();
    D(0, 0) = E.x() * (1 - nu_23 * nu_32) / k;
    D(1, 0) = E.y() * (nu_13 * nu_32 + nu_12) / k;
    D(2, 0) = E.z() * (nu_12 * nu_23 + nu_13) / k;

    D(0, 1) = E.x() * (nu_23 * nu_31 + nu_21) / k;
    D(1, 1) = E.y() * (1 - nu_13 * nu_31) / k;
    D(2, 1) = E.z() * (nu_13 * nu_21 + nu_23) / k;

    D(0, 2) = E.x() * (nu_21 * nu_32 + nu_31) / k;
    D(1, 2) = E.y() * (nu_12 * nu_31 + nu_32) / k;
    D(2, 2) = E.z() * (1 - nu_12 * nu_21) / k;

    D(3, 3) = G.z();
    D(4, 4) = G.y();
    D(5, 5) = G.x();

    m_D = D;
}